

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn_live.c
# Opt level: O2

void cmn_live_set(cmn_t *cmn,mfcc_t *vec)

{
  float fVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
          ,0x38,"Update from < %s >\n",cmn->repr);
  iVar2 = cmn->veclen;
  for (lVar4 = 0; lVar4 < iVar2; lVar4 = lVar4 + 1) {
    fVar1 = (float)vec[lVar4];
    cmn->cmn_mean[lVar4] = (mfcc_t)fVar1;
    cmn->sum[lVar4] = (mfcc_t)(fVar1 * 500.0);
  }
  cmn->nframe = 500;
  pcVar3 = cmn_update_repr(cmn);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
          ,0x3e,"Update to   < %s >\n",pcVar3);
  return;
}

Assistant:

void
cmn_live_set(cmn_t *cmn, mfcc_t const * vec)
{
    int32 i;

    E_INFO("Update from < %s >\n", cmn->repr);
    for (i = 0; i < cmn->veclen; i++) {
        cmn->cmn_mean[i] = vec[i];
        cmn->sum[i] = vec[i] * CMN_WIN;
    }
    cmn->nframe = CMN_WIN;
    E_INFO("Update to   < %s >\n", cmn_update_repr(cmn));
}